

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void jpge::DCT2D(int32 *p)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int32 z5_1;
  int32 u4_1;
  int32 u3_1;
  int32 u2_1;
  int32 u1_1;
  int32 t12_1;
  int32 t11_1;
  int32 t13_1;
  int32 t10_1;
  int32 t4_1;
  int32 t3_1;
  int32 t5_1;
  int32 t2_1;
  int32 t6_1;
  int32 t1_1;
  int32 t7_1;
  int32 t0_1;
  int32 s7_1;
  int32 s6_1;
  int32 s5_1;
  int32 s4_1;
  int32 s3_1;
  int32 s2_1;
  int32 s1_1;
  int32 s0_1;
  int32 z5;
  int32 u4;
  int32 u3;
  int32 u2;
  int32 u1;
  int32 t12;
  int32 t11;
  int32 t13;
  int32 t10;
  int32 t4;
  int32 t3;
  int32 t5;
  int32 t2;
  int32 t6;
  int32 t1;
  int32 t7;
  int32 t0;
  int32 s7;
  int32 s6;
  int32 s5;
  int32 s4;
  int32 s3;
  int32 s2;
  int32 s1;
  int32 s0;
  int32 *q;
  int32 c;
  int32 *p_local;
  
  _s1 = p;
  for (q._4_4_ = 7; -1 < q._4_4_; q._4_4_ = q._4_4_ + -1) {
    iVar7 = *_s1 + _s1[7];
    sVar4 = (short)*_s1 - (short)_s1[7];
    iVar8 = _s1[1] + _s1[6];
    sVar6 = (short)_s1[1] - (short)_s1[6];
    iVar9 = _s1[2] + _s1[5];
    sVar5 = (short)_s1[2] - (short)_s1[5];
    iVar10 = _s1[3] + _s1[4];
    sVar3 = (short)_s1[3] - (short)_s1[4];
    iVar11 = iVar7 + iVar10;
    sVar2 = (short)iVar7 - (short)iVar10;
    iVar7 = iVar8 + iVar9;
    sVar1 = (short)iVar8 - (short)iVar9;
    iVar8 = (short)(sVar1 + sVar2) * 0x1151;
    iVar12 = (short)(sVar3 + sVar6 + sVar5 + sVar4) * 0x25a1;
    iVar9 = (short)(sVar3 + sVar4) * -0x1ccd;
    iVar10 = (short)(sVar5 + sVar6) * -0x5203;
    iVar13 = iVar12 + (short)(sVar3 + sVar6) * -0x3ec5;
    iVar12 = iVar12 + (short)(sVar5 + sVar4) * -0xc7c;
    iVar14 = left_shifti(iVar11 + iVar7,2);
    *_s1 = iVar14;
    _s1[1] = sVar4 * 0x300b + iVar9 + iVar12 + 0x400 >> 0xb;
    _s1[2] = iVar8 + sVar2 * 0x187e + 0x400 >> 0xb;
    _s1[3] = sVar6 * 0x6254 + iVar10 + iVar13 + 0x400 >> 0xb;
    iVar7 = left_shifti(iVar11 - iVar7,2);
    _s1[4] = iVar7;
    _s1[5] = sVar5 * 0x41b3 + iVar10 + iVar12 + 0x400 >> 0xb;
    _s1[6] = iVar8 + sVar1 * -0x3b21 + 0x400 >> 0xb;
    _s1[7] = sVar3 * 0x98e + iVar9 + iVar13 + 0x400 >> 0xb;
    _s1 = _s1 + 8;
  }
  _s1 = p;
  for (q._4_4_ = 7; -1 < q._4_4_; q._4_4_ = q._4_4_ + -1) {
    iVar7 = *_s1 + _s1[0x38];
    sVar4 = (short)*_s1 - (short)_s1[0x38];
    iVar8 = _s1[8] + _s1[0x30];
    sVar6 = (short)_s1[8] - (short)_s1[0x30];
    iVar9 = _s1[0x10] + _s1[0x28];
    sVar5 = (short)_s1[0x10] - (short)_s1[0x28];
    iVar10 = _s1[0x18] + _s1[0x20];
    sVar3 = (short)_s1[0x18] - (short)_s1[0x20];
    iVar11 = iVar7 + iVar10;
    sVar2 = (short)iVar7 - (short)iVar10;
    iVar7 = iVar8 + iVar9;
    sVar1 = (short)iVar8 - (short)iVar9;
    iVar8 = (short)(sVar1 + sVar2) * 0x1151;
    iVar12 = (short)(sVar3 + sVar6 + sVar5 + sVar4) * 0x25a1;
    iVar9 = (short)(sVar3 + sVar4) * -0x1ccd;
    iVar10 = (short)(sVar5 + sVar6) * -0x5203;
    iVar13 = iVar12 + (short)(sVar3 + sVar6) * -0x3ec5;
    iVar12 = iVar12 + (short)(sVar5 + sVar4) * -0xc7c;
    *_s1 = iVar11 + iVar7 + 0x10 >> 5;
    _s1[8] = sVar4 * 0x300b + iVar9 + iVar12 + 0x20000 >> 0x12;
    _s1[0x10] = iVar8 + sVar2 * 0x187e + 0x20000 >> 0x12;
    _s1[0x18] = sVar6 * 0x6254 + iVar10 + iVar13 + 0x20000 >> 0x12;
    _s1[0x20] = (iVar11 - iVar7) + 0x10 >> 5;
    _s1[0x28] = sVar5 * 0x41b3 + iVar10 + iVar12 + 0x20000 >> 0x12;
    _s1[0x30] = iVar8 + sVar1 * -0x3b21 + 0x20000 >> 0x12;
    _s1[0x38] = sVar3 * 0x98e + iVar9 + iVar13 + 0x20000 >> 0x12;
    _s1 = _s1 + 1;
  }
  return;
}

Assistant:

static void DCT2D(int32* p)
	{
		int32 c, * q = p;
		for (c = 7; c >= 0; c--, q += 8)
		{
			int32 s0 = q[0], s1 = q[1], s2 = q[2], s3 = q[3], s4 = q[4], s5 = q[5], s6 = q[6], s7 = q[7];
			DCT1D(s0, s1, s2, s3, s4, s5, s6, s7);
			q[0] = left_shifti(s0, ROW_BITS); q[1] = DCT_DESCALE(s1, CONST_BITS - ROW_BITS); q[2] = DCT_DESCALE(s2, CONST_BITS - ROW_BITS); q[3] = DCT_DESCALE(s3, CONST_BITS - ROW_BITS);
			q[4] = left_shifti(s4, ROW_BITS); q[5] = DCT_DESCALE(s5, CONST_BITS - ROW_BITS); q[6] = DCT_DESCALE(s6, CONST_BITS - ROW_BITS); q[7] = DCT_DESCALE(s7, CONST_BITS - ROW_BITS);
		}
		for (q = p, c = 7; c >= 0; c--, q++)
		{
			int32 s0 = q[0 * 8], s1 = q[1 * 8], s2 = q[2 * 8], s3 = q[3 * 8], s4 = q[4 * 8], s5 = q[5 * 8], s6 = q[6 * 8], s7 = q[7 * 8];
			DCT1D(s0, s1, s2, s3, s4, s5, s6, s7);
			q[0 * 8] = DCT_DESCALE(s0, ROW_BITS + 3); q[1 * 8] = DCT_DESCALE(s1, CONST_BITS + ROW_BITS + 3); q[2 * 8] = DCT_DESCALE(s2, CONST_BITS + ROW_BITS + 3); q[3 * 8] = DCT_DESCALE(s3, CONST_BITS + ROW_BITS + 3);
			q[4 * 8] = DCT_DESCALE(s4, ROW_BITS + 3); q[5 * 8] = DCT_DESCALE(s5, CONST_BITS + ROW_BITS + 3); q[6 * 8] = DCT_DESCALE(s6, CONST_BITS + ROW_BITS + 3); q[7 * 8] = DCT_DESCALE(s7, CONST_BITS + ROW_BITS + 3);
		}
	}